

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<std::__cxx11::string,char[15],std::__cxx11::string,char[13],std::__cxx11::string,char[5],std::__cxx11::string>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char (*args_1) [15],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                   char (*args_3) [13],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
                   char (*args_5) [5],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  size_t local_b0;
  char *pcStack_a8;
  size_type local_a0;
  pointer local_98;
  size_t local_90;
  char (*local_88) [15];
  size_type local_80;
  pointer local_78;
  size_t local_70;
  char (*local_68) [13];
  size_type local_60;
  pointer local_58;
  size_t local_50;
  char (*local_48) [5];
  size_type local_40;
  pointer local_38;
  
  local_c0._M_len = (a->View_)._M_len;
  local_c0._M_str = (a->View_)._M_str;
  local_b0 = (b->View_)._M_len;
  pcStack_a8 = (b->View_)._M_str;
  local_98 = (args->_M_dataplus)._M_p;
  local_a0 = args->_M_string_length;
  local_90 = strlen(*args_1);
  local_78 = (args_2->_M_dataplus)._M_p;
  local_80 = args_2->_M_string_length;
  local_88 = args_1;
  local_70 = strlen(*args_3);
  local_68 = args_3;
  local_58 = (args_4->_M_dataplus)._M_p;
  local_60 = args_4->_M_string_length;
  local_50 = strlen(*args_5);
  local_48 = args_5;
  local_38 = (args_6->_M_dataplus)._M_p;
  local_40 = args_6->_M_string_length;
  views._M_len = 9;
  views._M_array = &local_c0;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}